

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::hitObjectNVCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  char *pcVar4;
  pointer pcVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0xf) {
    bVar1 = containsFieldWithBasicType(this,type,EbtHitObjectNV);
    if (bVar1) {
      iVar2 = (*type->_vptr_TType[5])(type);
      pcVar3 = *(char **)(CONCAT44(extraout_var,iVar2) + 8);
      pcVar5 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar4 = "struct is not allowed to contain hitObjectNV:";
      goto LAB_004ad054;
    }
  }
  iVar2 = (*type->_vptr_TType[7])(type);
  if (iVar2 == 0x14) {
    iVar2 = (*type->_vptr_TType[0xb])(type);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7e) != 0) {
      pcVar5 = (identifier->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar4 = 
      "hitObjectNV can only be declared in global or function scope with no storage qualifier:";
      pcVar3 = "hitObjectNV";
LAB_004ad054:
      (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar4,pcVar3,pcVar5,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void TParseContext::hitObjectNVCheck(const TSourceLoc & loc, const TType & type, const TString & identifier)
{
    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtHitObjectNV)) {
        error(loc, "struct is not allowed to contain hitObjectNV:", type.getTypeName().c_str(), identifier.c_str());
    } else if (type.getBasicType() == EbtHitObjectNV) {
        TStorageQualifier qualifier = type.getQualifier().storage;
        if (qualifier != EvqGlobal && qualifier != EvqTemporary) {
            error(loc, "hitObjectNV can only be declared in global or function scope with no storage qualifier:", "hitObjectNV", identifier.c_str());
        }
    }
}